

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O2

size_t quantize_iq2_xs(float *src,void *dst,int64_t nrow,int64_t n_per_row,float *quant_weights)

{
  ggml_fp16_t *pgVar1;
  byte *pbVar2;
  int iVar3;
  uint64_t *grid;
  int *piVar4;
  uint16_t *puVar5;
  ggml_fp16_t gVar6;
  int i;
  long lVar7;
  long lVar8;
  long lVar9;
  float *pfVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  float *pfVar15;
  char *pcVar16;
  int8_t *piVar17;
  int k_4;
  long lVar18;
  float *pfVar19;
  int iVar20;
  byte bVar21;
  int i_4;
  ulong uVar22;
  byte bVar23;
  byte bVar24;
  int i_1;
  long lVar25;
  char *pcVar26;
  int8_t *piVar27;
  int k_1;
  long lVar28;
  bool bVar29;
  float fVar30;
  float fVar31;
  undefined4 uVar32;
  float fVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  uint8_t block_signs [2];
  _Bool is_on_grid [2];
  float local_278;
  _Bool is_on_grid_aux [2];
  float *local_260;
  float *local_258;
  float *local_248;
  float local_238;
  int8_t L [16];
  void *local_208;
  float *local_200;
  float *local_1f0;
  int8_t Laux [16];
  float xval [16];
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  float weight [16];
  float waux [16];
  float scales [16];
  
  if ((char)n_per_row == '\0') {
    lVar7 = n_per_row >> 8;
    lVar28 = 0;
    if (0 < lVar7) {
      lVar28 = lVar7;
    }
    lVar8 = 0;
    if (0 < nrow) {
      lVar8 = nrow;
    }
    lVar11 = 0;
    local_260 = src;
    local_208 = dst;
    while( true ) {
      puVar5 = iq2_data[1].neighbours;
      piVar4 = iq2_data[1].map;
      grid = iq2_data[1].grid;
      if (lVar11 == lVar8) {
        return nrow * lVar7 * 0x4a;
      }
      if (quant_weights == (float *)0x0) break;
      if (iq2_data[1].map == (int *)0x0) {
        pcVar26 = "kmap_q2xs && \"forgot to call ggml_quantize_init()?\"";
        iVar20 = 0xc40;
        goto LAB_001385ff;
      }
      if (iq2_data[1].grid == (uint64_t *)0x0) {
        pcVar26 = "kgrid_q2xs && \"forgot to call ggml_quantize_init()?\"";
        iVar20 = 0xc41;
        goto LAB_001385ff;
      }
      if (iq2_data[1].neighbours == (uint16_t *)0x0) {
        pcVar26 = "kneighbors_q2xs && \"forgot to call ggml_quantize_init()?\"";
        iVar20 = 0xc42;
        goto LAB_001385ff;
      }
      local_258 = local_260;
      local_200 = quant_weights;
      for (lVar18 = 0; lVar18 != lVar28; lVar18 = lVar18 + 1) {
        lVar9 = lVar18 * 0x4a;
        pgVar1 = (ggml_fp16_t *)((long)local_208 + lVar9);
        *(undefined2 *)((long)local_208 + lVar9) = 0;
        local_108 = 0;
        uStack_100 = 0;
        local_118 = 0;
        uStack_110 = 0;
        local_128 = 0;
        uStack_120 = 0;
        local_138 = 0;
        uStack_130 = 0;
        *(undefined8 *)((long)local_208 + lVar9 + 0x42) = 0;
        local_278 = 0.0;
        for (lVar9 = 0; lVar9 != 0x100; lVar9 = lVar9 + 1) {
          local_278 = local_278 + local_258[lVar9] * local_258[lVar9];
        }
        fVar39 = 0.0;
        local_1f0 = local_200;
        local_248 = local_258;
        for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
          for (lVar25 = 0; lVar25 != 0x10; lVar25 = lVar25 + 1) {
            fVar31 = local_1f0[lVar25];
            fVar30 = local_248[lVar25] * local_248[lVar25] + local_278 * 0.00390625;
            if (fVar30 < 0.0) {
              fVar30 = sqrtf(fVar30);
            }
            else {
              fVar30 = SQRT(fVar30);
            }
            weight[lVar25] = fVar31 * fVar30;
          }
          for (lVar25 = 0; lVar25 != 0x10; lVar25 = lVar25 + 1) {
            fVar31 = weight[lVar25];
            if (fVar31 < 0.0) {
              fVar31 = sqrtf(fVar31);
            }
            else {
              fVar31 = SQRT(fVar31);
            }
            waux[lVar25] = fVar31;
          }
          pfVar10 = weight;
          pfVar19 = xval;
          pfVar15 = local_248;
          for (lVar25 = 0; lVar25 != 2; lVar25 = lVar25 + 1) {
            bVar24 = 0;
            bVar21 = 0;
            for (lVar12 = 0; lVar12 != 8; lVar12 = lVar12 + 1) {
              fVar31 = pfVar15[lVar12];
              bVar29 = fVar31 < -fVar31;
              fVar30 = -fVar31;
              if (!bVar29) {
                fVar30 = fVar31;
              }
              bVar23 = (byte)(1 << ((byte)lVar12 & 0x1f));
              if (!bVar29) {
                bVar23 = 0;
              }
              bVar21 = bVar21 + bVar29;
              bVar24 = bVar23 | bVar24;
              pfVar19[lVar12] = fVar30;
            }
            if ((bool)(bVar21 & 1)) {
              fVar31 = weight[lVar25 * 8] * local_260[lVar18 * 0x100 + lVar9 * 0x10 + lVar25 * 8] *
                       local_260[lVar18 * 0x100 + lVar9 * 0x10 + lVar25 * 8];
              uVar13 = 0;
              for (uVar22 = 1; uVar22 != 8; uVar22 = uVar22 + 1) {
                fVar30 = pfVar10[uVar22] * pfVar15[uVar22] * pfVar15[uVar22];
                if (fVar30 < fVar31) {
                  uVar13 = uVar22 & 0xffffffff;
                  fVar31 = fVar30;
                }
              }
              iVar20 = (int)lVar25 * 8 + (int)uVar13;
              xval[iVar20] = -xval[iVar20];
              bVar24 = bVar24 ^ (byte)(1 << ((byte)uVar13 & 0x1f));
            }
            block_signs[lVar25] = bVar24 & 0x7f;
            pfVar19 = pfVar19 + 8;
            pfVar15 = pfVar15 + 8;
            pfVar10 = pfVar10 + 8;
          }
          fVar31 = xval[0];
          for (lVar25 = 1; lVar25 != 0x10; lVar25 = lVar25 + 1) {
            if (fVar31 <= xval[lVar25]) {
              fVar31 = xval[lVar25];
            }
          }
          if (1e-15 <= fVar31) {
            local_238 = fVar31 / 5.0;
            is_on_grid[0] = true;
            is_on_grid[1] = true;
            fVar30 = 0.0;
            for (iVar20 = -9; iVar20 != 10; iVar20 = iVar20 + 1) {
              fVar37 = ((float)iVar20 * 0.1 + 5.0) / fVar31;
              pfVar10 = xval;
              pcVar26 = Laux;
              for (lVar25 = 0; lVar25 != 2; lVar25 = lVar25 + 1) {
                for (lVar12 = 0; lVar12 != 8; lVar12 = lVar12 + 1) {
                  uVar14 = (uint)((pfVar10[lVar12] * fVar37 + -1.0) * 0.5 + 12582912.0) & 0x7fffff;
                  if (0x400001 < uVar14) {
                    uVar14 = 0x400002;
                  }
                  if (uVar14 < 0x400001) {
                    uVar14 = 0;
                  }
                  pcVar26[lVar12] = (char)uVar14;
                }
                uVar22 = 0;
                pcVar16 = pcVar26;
                for (lVar12 = 0; lVar12 != 0x10; lVar12 = lVar12 + 2) {
                  uVar22 = (ulong)((uint)uVar22 | (int)*pcVar16 << ((byte)lVar12 & 0x1f));
                  pcVar16 = pcVar16 + 1;
                }
                iVar3 = piVar4[uVar22 & 0xffff];
                is_on_grid_aux[lVar25] = true;
                if ((long)iVar3 < 0) {
                  is_on_grid_aux[lVar25] = false;
                  iq2_find_best_neighbour
                            (puVar5 + (-1 - (long)iVar3),grid,xval + lVar25 * 8,waux + lVar25 * 8,
                             1.0 / fVar37,Laux + lVar25 * 8);
                }
                pcVar26 = pcVar26 + 8;
                pfVar10 = pfVar10 + 8;
              }
              fVar37 = 0.0;
              fVar33 = 0.0;
              for (lVar25 = 0; lVar25 != 0x10; lVar25 = lVar25 + 1) {
                fVar38 = (float)(Laux[lVar25] * 2 + 1);
                fVar37 = fVar37 + fVar38 * fVar38 * weight[lVar25];
                fVar33 = fVar33 + fVar38 * xval[lVar25] * weight[lVar25];
              }
              if ((0.0 < fVar37) && (fVar30 * fVar37 < fVar33 * fVar33)) {
                for (lVar25 = 0; lVar25 != 0x10; lVar25 = lVar25 + 1) {
                  L[lVar25] = Laux[lVar25];
                }
                for (lVar25 = 0; lVar25 != 2; lVar25 = lVar25 + 1) {
                  is_on_grid[lVar25] = is_on_grid_aux[lVar25];
                }
                local_238 = fVar33 / fVar37;
                fVar30 = fVar33 * local_238;
              }
            }
            iVar20 = 0;
            for (lVar25 = 0; lVar25 != 2; lVar25 = lVar25 + 1) {
              iVar20 = iVar20 + (is_on_grid[lVar25] ^ 1);
            }
            if ((iVar20 != 0) && (0.0 < local_238)) {
              pfVar10 = xval;
              piVar27 = L;
              for (lVar25 = 0; lVar25 != 2; lVar25 = lVar25 + 1) {
                if (is_on_grid[lVar25] == false) {
                  uVar22 = 0;
                  piVar17 = piVar27;
                  for (lVar12 = 0; lVar12 != 0x10; lVar12 = lVar12 + 2) {
                    uVar14 = (uint)((*(float *)((long)pfVar10 + lVar12 * 2) * (1.0 / local_238) +
                                    -1.0) * 0.5 + 12582912.0) & 0x7fffff;
                    if (0x400001 < uVar14) {
                      uVar14 = 0x400002;
                    }
                    if (uVar14 < 0x400001) {
                      uVar14 = 0x400000;
                    }
                    uVar22 = (ulong)((uint)uVar22 | uVar14 << ((byte)lVar12 & 0x1f));
                    *piVar17 = (int8_t)uVar14;
                    piVar17 = piVar17 + 1;
                  }
                  if ((long)piVar4[uVar22 & 0xffff] < 0) {
                    iq2_find_best_neighbour
                              (puVar5 + (-1 - (long)piVar4[uVar22 & 0xffff]),grid,xval + lVar25 * 8,
                               waux + lVar25 * 8,local_238,L + lVar25 * 8);
                  }
                }
                piVar27 = piVar27 + 8;
                pfVar10 = pfVar10 + 8;
              }
              fVar31 = 0.0;
              fVar30 = 0.0;
              for (lVar25 = 0; lVar25 != 0x10; lVar25 = lVar25 + 1) {
                fVar37 = (float)(L[lVar25] * 2 + 1);
                fVar31 = fVar31 + fVar37 * xval[lVar25] * weight[lVar25];
                fVar30 = fVar30 + fVar37 * fVar37 * weight[lVar25];
              }
              local_238 = (float)(~-(uint)(0.0 < fVar30) & (uint)local_238 |
                                 (uint)(fVar31 / fVar30) & -(uint)(0.0 < fVar30));
            }
            if (local_238 < 0.0) {
              for (lVar25 = 0; lVar25 != 2; lVar25 = lVar25 + 1) {
                block_signs[lVar25] = ~block_signs[lVar25] & 0x7f;
              }
              local_238 = -local_238;
            }
            pcVar26 = L;
            for (lVar25 = 0; lVar25 != 2; lVar25 = lVar25 + 1) {
              uVar22 = 0;
              pcVar16 = pcVar26;
              for (lVar12 = 0; lVar12 != 0x10; lVar12 = lVar12 + 2) {
                uVar22 = (ulong)((uint)uVar22 | (int)*pcVar16 << ((byte)lVar12 & 0x1f));
                pcVar16 = pcVar16 + 1;
              }
              if (piVar4[uVar22 & 0xffff] < 0) {
                printf("Oops: found point %u not on grid:");
                lVar28 = 8;
                while (bVar29 = lVar28 != 0, lVar28 = lVar28 + -1, bVar29) {
                  printf(" %d",(ulong)(uint)(int)*pcVar26);
                  pcVar26 = pcVar26 + 1;
                }
                putchar(10);
                ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-quants.c"
                           ,0xccf,"fatal error");
              }
              *(ushort *)((long)&local_138 + (lVar25 + lVar9 * 2) * 2) =
                   (ushort)block_signs[lVar25] << 9 | (ushort)piVar4[uVar22 & 0xffff];
              pcVar26 = pcVar26 + 8;
            }
            if (local_238 < 0.0) {
              pcVar26 = "scale >= 0";
              iVar20 = 0xcd3;
              goto LAB_001385ff;
            }
            scales[lVar9] = local_238;
            if (fVar39 <= local_238) {
              fVar39 = local_238;
            }
          }
          else {
            scales[lVar9] = 0.0;
            L[0] = '\0';
            L[1] = '\0';
            L[2] = '\0';
            L[3] = '\0';
            L[4] = '\0';
            L[5] = '\0';
            L[6] = '\0';
            L[7] = '\0';
            L[8] = '\0';
            L[9] = '\0';
            L[10] = '\0';
            L[0xb] = '\0';
            L[0xc] = '\0';
            L[0xd] = '\0';
            L[0xe] = '\0';
            L[0xf] = '\0';
          }
          local_248 = local_248 + 0x10;
          local_1f0 = local_1f0 + 0x10;
        }
        if ((fVar39 != 0.0) || (NAN(fVar39))) {
          gVar6 = ggml_compute_fp32_to_fp16(fVar39 / 31.0);
          *pgVar1 = gVar6;
          for (uVar22 = 0; uVar22 != 0x10; uVar22 = uVar22 + 1) {
            uVar14 = (uint)((scales[uVar22] * (1.0 / (fVar39 / 31.0)) + -1.0) * 0.5 + 12582912.0) &
                     0x7fffff;
            if (0x40000e < uVar14) {
              uVar14 = 0x40000f;
            }
            if (uVar14 < 0x400001) {
              uVar14 = 0;
            }
            uVar13 = uVar22 >> 1 & 0x7fffffff;
            if ((uVar22 & 1) == 0) {
              *(char *)((long)pgVar1 + uVar13 + 0x42) = (char)uVar14;
            }
            else {
              pbVar2 = (byte *)((long)pgVar1 + uVar13 + 0x42);
              *pbVar2 = *pbVar2 | (char)uVar14 << 4;
            }
          }
          *(undefined8 *)(pgVar1 + 0x19) = local_108;
          *(undefined8 *)(pgVar1 + 0x1d) = uStack_100;
          *(undefined4 *)(pgVar1 + 0x11) = (undefined4)local_118;
          *(undefined4 *)(pgVar1 + 0x13) = local_118._4_4_;
          *(undefined4 *)(pgVar1 + 0x15) = (undefined4)uStack_110;
          *(undefined4 *)(pgVar1 + 0x17) = uStack_110._4_4_;
          *(undefined4 *)(pgVar1 + 9) = (undefined4)local_128;
          *(undefined4 *)(pgVar1 + 0xb) = local_128._4_4_;
          *(undefined4 *)(pgVar1 + 0xd) = (undefined4)uStack_120;
          *(undefined4 *)(pgVar1 + 0xf) = uStack_120._4_4_;
          uVar32 = (undefined4)local_138;
          uVar34 = local_138._4_4_;
          uVar35 = (undefined4)uStack_130;
          uVar36 = uStack_130._4_4_;
        }
        else {
          uVar32 = 0;
          uVar34 = 0;
          uVar35 = 0;
          uVar36 = 0;
          pgVar1[0x19] = 0;
          pgVar1[0x1a] = 0;
          pgVar1[0x1b] = 0;
          pgVar1[0x1c] = 0;
          pgVar1[0x1d] = 0;
          pgVar1[0x1e] = 0;
          pgVar1[0x1f] = 0;
          pgVar1[0x20] = 0;
          pgVar1[0x11] = 0;
          pgVar1[0x12] = 0;
          pgVar1[0x13] = 0;
          pgVar1[0x14] = 0;
          pgVar1[0x15] = 0;
          pgVar1[0x16] = 0;
          pgVar1[0x17] = 0;
          pgVar1[0x18] = 0;
          pgVar1[9] = 0;
          pgVar1[10] = 0;
          pgVar1[0xb] = 0;
          pgVar1[0xc] = 0;
          pgVar1[0xd] = 0;
          pgVar1[0xe] = 0;
          pgVar1[0xf] = 0;
          pgVar1[0x10] = 0;
        }
        *(undefined4 *)(pgVar1 + 1) = uVar32;
        *(undefined4 *)(pgVar1 + 3) = uVar34;
        *(undefined4 *)(pgVar1 + 5) = uVar35;
        *(undefined4 *)(pgVar1 + 7) = uVar36;
        local_258 = local_258 + 0x100;
        local_200 = local_200 + 0x100;
      }
      local_260 = local_260 + n_per_row;
      local_208 = (void *)((long)local_208 + lVar7 * 0x4a);
      lVar11 = lVar11 + 1;
    }
    pcVar26 = "quant_weights && \"missing quantization weights\"";
    iVar20 = 0xc3f;
  }
  else {
    pcVar26 = "n_per_row%QK_K == 0";
    iVar20 = 0xcf8;
  }
LAB_001385ff:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-quants.c",
             iVar20,"GGML_ASSERT(%s) failed",pcVar26);
}

Assistant:

size_t quantize_iq2_xs(const float * GGML_RESTRICT src, void * GGML_RESTRICT dst, int64_t nrow, int64_t n_per_row, const float * quant_weights) {
    GGML_ASSERT(n_per_row%QK_K == 0);
    int64_t nblock = n_per_row/QK_K;
    char * qrow = (char *)dst;
    for (int64_t row = 0; row < nrow; ++row) {
        quantize_row_iq2_xs_impl(src, qrow, n_per_row, quant_weights);
        src += n_per_row;
        qrow += nblock*sizeof(block_iq2_xs);
    }
    return nrow * nblock * sizeof(block_iq2_xs);
}